

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfSubscriber.c
# Opt level: O2

void timerCb(sbfTimer timer,void *closure)

{
  ulong in_RAX;
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  undefined8 in_R9;
  
  uVar3 = (ulong)gMessages;
  if (uVar3 == 0) {
    uVar1 = 0;
  }
  else {
    in_RAX = gTimeTotal / uVar3;
    uVar1 = in_RAX;
  }
  uVar2 = 0;
  if (gTimeLow != 0xffffffffffffffff) {
    uVar2 = gTimeLow;
  }
  printf("%u low=%llu average=%llu high=%llu\n",uVar3,uVar2,uVar1,gTimeHigh,in_R9,in_RAX);
  fflush(_stdout);
  gMessages = 0;
  gTimeLow = 0xffffffffffffffff;
  gTimeTotal = 0;
  gTimeHigh = 0;
  return;
}

Assistant:

static void
timerCb (sbfTimer timer, void* closure)
{
    printf ("%u low=%llu average=%llu high=%llu" SBF_EOL,
            gMessages,
            gTimeLow == UINT64_MAX ? 0 : (unsigned long long)gTimeLow,
            gMessages == 0 ? 0 : (unsigned long long)gTimeTotal / gMessages,
            (unsigned long long)gTimeHigh);
    fflush (stdout);

    gMessages = 0;
    gTimeLow = UINT64_MAX;
    gTimeTotal = 0;
    gTimeHigh = 0;
}